

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O3

string __thiscall mjs::regexp_object::to_string(regexp_object *this)

{
  gc_heap *h;
  wostream *pwVar1;
  undefined8 extraout_RDX;
  long in_RSI;
  string sVar2;
  wostringstream woss;
  gc_heap_ptr_untyped local_1c0;
  slot local_1b0 [2];
  undefined1 local_1a0 [16];
  wostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::wostringstream::wostringstream(local_190);
  pwVar1 = std::operator<<((wostream *)local_190,"/");
  gc_heap::unsafe_create_from_position<mjs::gc_string>
            ((gc_heap *)local_1a0,(uint32_t)*(undefined8 *)(in_RSI + 8));
  local_1c0.heap_ = (gc_heap *)local_1a0._0_8_;
  local_1c0.pos_ = local_1a0._8_4_;
  if ((slot *)local_1a0._0_8_ != (slot *)0x0) {
    gc_heap::attach((gc_heap *)local_1a0._0_8_,&local_1c0);
  }
  pwVar1 = mjs::operator<<(pwVar1,(string *)&local_1c0);
  pwVar1 = std::operator<<(pwVar1,"/");
  mjs::operator<<(pwVar1,*(regexp_flag *)(in_RSI + 0x38));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1c0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a0);
  h = *(gc_heap **)(in_RSI + 8);
  std::__cxx11::wstringbuf::str();
  local_1a0._0_8_ = CONCAT44(local_1c0._12_4_,local_1c0.pos_);
  local_1a0._8_8_ = local_1c0.heap_;
  string::string((string *)this,h,(wstring_view *)local_1a0);
  if ((slot *)local_1c0.heap_ != local_1b0) {
    operator_delete(local_1c0.heap_,local_1b0[0].representation * 4 + 4);
  }
  std::__cxx11::wostringstream::~wostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  sVar2.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  sVar2.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar2.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string to_string() const {
        std::wostringstream woss;
        woss << "/" << source_.track(heap()) << "/" << flags_;
        return string{heap(), woss.str()};
    }